

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.c
# Opt level: O1

void solver_debug_check(solver_t *s,int result)

{
  clause_conflict *clause;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  solver_debug_check_trail(s);
  fprintf(_stdout,"[Satoko] Checking clauses (%d)... \n",(ulong)s->originals->size);
  uVar1 = (ulong)s->originals->size;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      clause = (clause_conflict *)(s->all_clauses->data + s->originals->data[uVar2]);
      uVar4 = (ulong)clause->size;
      uVar6 = 0;
      if (uVar4 != 0) {
        uVar7 = (ulong)s->trail->size;
        uVar5 = 0;
        do {
          if (uVar7 != 0) {
            uVar3 = 0;
            do {
              uVar6 = uVar5;
              if (s->trail->data[uVar3] == *(uint *)(&clause[1].field_0x0 + uVar5 * 4))
              goto LAB_008fe7ab;
              uVar3 = uVar3 + 1;
            } while (uVar7 != uVar3);
          }
          uVar5 = uVar5 + 1;
          uVar6 = uVar4;
        } while (uVar5 != uVar4);
      }
LAB_008fe7ab:
      if ((result == 1) && ((uint)uVar6 == clause->size)) {
        fprintf(_stdout,"[Satoko] FOUND UNSAT CLAUSE: (%d) ");
        clause_print(clause);
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver.c"
                      ,0x2fd,"void solver_debug_check(solver_t *, int)");
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != uVar1);
  }
  fwrite("[Satoko] All SAT - OK\n",0x16,1,_stdout);
  return;
}

Assistant:

void solver_debug_check(solver_t *s, int result)
{
    unsigned cref, i;
    solver_debug_check_trail(s);
    fprintf(stdout, "[Satoko] Checking clauses (%d)... \n", vec_uint_size(s->originals));
    vec_uint_foreach(s->originals, cref, i) {
        unsigned j;
        struct clause *clause = clause_fetch(s, cref);
        for (j = 0; j < clause->size; j++) {
            if (vec_uint_find(s->trail, clause->data[j].lit)) {
                break;
            }
        }
        if (result == SATOKO_SAT && j == clause->size) {
            fprintf(stdout, "[Satoko] FOUND UNSAT CLAUSE: (%d) ", i);
            clause_print(clause);
            assert(0);
        }
    }
    fprintf(stdout, "[Satoko] All SAT - OK\n");
}